

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_namespace::translate
          (method_namespace *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  _Elt_pointer ppsVar2;
  element_type *peVar3;
  token_base *tbp;
  _Elt_pointer pdVar4;
  _Elt_pointer ppsVar5;
  int iVar6;
  statement_namespace *this_00;
  const_reference pptVar7;
  token_base **pptVar8;
  _Elt_pointer pptVar9;
  compile_error *this_01;
  long lVar10;
  ulong uVar11;
  context_t *context_00;
  long lVar12;
  _Elt_pointer ppsVar13;
  _Map_pointer pppsVar14;
  _Self __tmp;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  allocator_type local_179;
  context_t local_178;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_168;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_148;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_f8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_a8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_58;
  
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&local_f8,0);
  peVar3 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_168._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_168._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_168._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_168._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar12 = (long)local_168._M_cur - (long)local_168._M_first;
  lVar10 = lVar12 >> 4;
  uVar1 = lVar10 * -0x3333333333333333 + 1;
  if (uVar1 < 6) {
    local_168._M_cur = local_168._M_cur + 1;
  }
  else {
    if (lVar12 < -0x4f) {
      uVar11 = ~((lVar10 * 0x3333333333333333 - 2U) / 6);
    }
    else {
      uVar11 = uVar1 / 6;
    }
    local_168._M_node = local_168._M_node + uVar11;
    local_168._M_first = *local_168._M_node;
    local_168._M_last = local_168._M_first + 6;
    local_168._M_cur = local_168._M_first + uVar11 * -6 + uVar1;
  }
  local_58._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&local_148,&local_168,&local_58,&local_179);
  context_00 = &peVar3->context;
  translator_type::translate
            (&peVar3->translator,context_00,&local_148,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_f8,false);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque(&local_148);
  ppsVar5 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppsVar13 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppsVar2 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppsVar14 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
  while( true ) {
    if (ppsVar13 == ppsVar5) {
      this_00 = (statement_namespace *)
                statement_base::operator_new((statement_base *)0x90,(size_t)context_00);
      pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                          ((raw->
                           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                           )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
      local_148.
      super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(*pptVar7)[1]._vptr_token_base;
      pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_148);
      tbp = *pptVar8;
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_a8,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_f8);
      local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pdVar4 = (raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar9 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar9 ==
          (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar9 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_namespace::statement_namespace
                (this_00,tbp,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_a8,
                 &local_178,pptVar9[-1]);
      if (local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_a8);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_f8);
      return &this_00->super_statement_base;
    }
    iVar6 = (*(*ppsVar13)->_vptr_statement_base[2])();
    if ((((iVar6 != 2) && (iVar6 = (*(*ppsVar13)->_vptr_statement_base[2])(), iVar6 != 4)) &&
        (iVar6 = (*(*ppsVar13)->_vptr_statement_base[2])(), iVar6 != 7)) &&
       (((iVar6 = (*(*ppsVar13)->_vptr_statement_base[2])(), iVar6 != 0x17 &&
         (iVar6 = (*(*ppsVar13)->_vptr_statement_base[2])(), iVar6 != 6)) &&
        (iVar6 = (*(*ppsVar13)->_vptr_statement_base[2])(), iVar6 != 0x16)))) break;
    ppsVar13 = ppsVar13 + 1;
    if (ppsVar13 == ppsVar2) {
      ppsVar13 = pppsVar14[1];
      pppsVar14 = pppsVar14 + 1;
      ppsVar2 = ppsVar13 + 0x40;
    }
  }
  this_01 = (compile_error *)__cxa_allocate_exception(0x28);
  local_148.
  super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &local_148.
        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"Unexpected statement in namespace definition.","");
  compile_error::compile_error(this_01,(string *)&local_148);
  __cxa_throw(this_01,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *
	method_namespace::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body)
			if (ptr->get_type() != statement_types::import_ && ptr->get_type() != statement_types::involve_ &&
			        ptr->get_type() != statement_types::var_ && ptr->get_type() != statement_types::function_ &&
			        ptr->get_type() != statement_types::namespace_ && ptr->get_type() != statement_types::struct_)
				throw compile_error("Unexpected statement in namespace definition.");
		return new statement_namespace(static_cast<token_expr *>(raw.front().at(1))->get_tree().root().data(), body,
		                               context, raw.front().back());
	}